

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
mxx::impl::
sample_arbit_decomp<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,impl *this,long begin,
          int param_4,comm *param_5,undefined8 param_6)

{
  int iVar1;
  pointer piVar2;
  unsigned_long uVar3;
  long lVar4;
  int *piVar5;
  long lVar6;
  size_type __new_size;
  ulong uVar7;
  pointer piVar8;
  long lVar9;
  long lVar10;
  vector<int,_std::allocator<int>_> all_samples;
  size_t local_size;
  
  local_size = begin - (long)this >> 2;
  uVar3 = allreduce<unsigned_long,std::plus<unsigned_long>>(&local_size,param_5);
  iVar1 = param_5->m_size;
  lVar9 = (long)iVar1;
  lVar10 = (long)param_4;
  if (local_size == 0) {
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    uVar7 = (uVar3 + local_size * lVar10 * lVar9) - 1;
    __new_size = 1;
    if (uVar3 <= uVar7) {
      __new_size = uVar7 / uVar3;
    }
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::resize(__return_storage_ptr__,__new_size);
    piVar8 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (uVar7 = 0; (long)piVar2 - (long)piVar8 >> 2 != uVar7; uVar7 = uVar7 + 1) {
      this = this + (local_size / (__new_size + 1) + (ulong)(uVar7 < local_size % (__new_size + 1)))
                    * 4;
      piVar8[uVar7] = *(int *)(this + -4);
    }
  }
  gatherv<int>(&all_samples,__return_storage_ptr__,0,param_5);
  if (param_5->m_rank == 0) {
    std::
    __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<int>>>
              (all_samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               all_samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    piVar8 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = (long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar8;
    lVar4 = (long)uVar7 >> 2;
    if (lVar4 != lVar9 + -1) {
      std::vector<int,_std::allocator<int>_>::resize(__return_storage_ptr__,(long)(iVar1 + -1));
      piVar8 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = (long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar8;
      lVar4 = (long)uVar7 >> 2;
    }
    piVar5 = all_samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + lVar10 + -1;
    for (lVar6 = 0; lVar4 != lVar6; lVar6 = lVar6 + 1) {
      piVar8[lVar6] = *piVar5;
      piVar5 = piVar5 + lVar10;
    }
  }
  else {
    piVar8 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = (long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar8;
    lVar4 = (long)uVar7 >> 2;
  }
  if (lVar4 != lVar9 + -1) {
    std::vector<int,_std::allocator<int>_>::resize(__return_storage_ptr__,lVar9 - 1);
    piVar8 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = (long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar8;
  }
  MPI_Bcast(piVar8,uVar7 >> 2,param_6,0,param_5->mpi_comm);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&all_samples.super__Vector_base<int,_std::allocator<int>_>);
  return __return_storage_ptr__;
}

Assistant:

std::vector<typename std::iterator_traits<_Iterator>::value_type>
sample_arbit_decomp(_Iterator begin, _Iterator end, _Compare comp, int s, const mxx::comm& comm, MPI_Datatype mpi_dt) {
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;
    std::size_t local_size = std::distance(begin, end);

    // get total size n
    std::size_t total_size = mxx::allreduce(local_size, comm);

    // p = number of processes
    int p = comm.size();

    //  pick a total of s*p samples, thus locally pick ceil((local_size/n)*s*p)
    //  and at least one samples from each processor.
    //  this will result in at least s*p samples.
    std::size_t local_s;
    if (local_size == 0)
        local_s = 0;
    else
        local_s = std::max<std::size_t>(((local_size*s*p)+total_size-1)/total_size, 1);

    //. init samples
    std::vector<value_type> local_splitters;

    // pick local samples
    if (local_s > 0) {
        local_splitters.resize(local_s);
        _Iterator pos = begin;
        for (std::size_t i = 0; i < local_splitters.size(); ++i)
        {
            std::size_t bucket_size = local_size / (local_s+1) + (i < (local_size % (local_s+1)) ? 1 : 0);
            // pick last element of each bucket
            pos += (bucket_size-1);
            local_splitters[i] = *pos;
            ++pos;
        }
    }

    // 2. gather samples to `rank = 0`
    // - TODO: rather call sample sort
    //         recursively and implement a base case for samplesort which does
    //         gather to rank=0, local sort and redistribute
    std::vector<value_type> all_samples = mxx::gatherv(local_splitters, 0, comm);

    // sort and pick p-1 samples on master
    if (comm.rank() == 0) {
        // 3. local sort on master
        std::sort(all_samples.begin(), all_samples.end(), comp);

        // 4. pick p-1 splitters and broadcast them
        if (local_splitters.size() != (size_t) p-1)
        {
            local_splitters.resize(p-1);
        }
        // split into `p` pieces and choose the `p-1` splitting elements
        _Iterator pos = all_samples.begin();
        for (std::size_t i = 0; i < local_splitters.size(); ++i)
        {
            std::size_t bucket_size = (p*s) / p + (i < static_cast<std::size_t>((p*s) % p) ? 1 : 0);
            // pick last element of each bucket
            local_splitters[i] = *(pos + (bucket_size-1));
            pos += bucket_size;
        }
    }

    // size splitters for receiving
    if (local_splitters.size() != (size_t)p-1) {
        local_splitters.resize(p-1);
    }

    // 4. broadcast and receive final splitters
    MPI_Bcast(&local_splitters[0], local_splitters.size(), mpi_dt, 0, comm);

    return local_splitters;
}